

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::randomize_normal(Tensor *val,real mean,real stddev)

{
  runtime_error *this;
  long in_RDI;
  anon_class_8_1_c254ac82 b;
  normal_distribution<float> distribution;
  float *in_stack_ffffffffffffffa8;
  normal_distribution<float> *in_stack_ffffffffffffffb0;
  anon_class_8_1_c254ac82 __gen;
  
  std::normal_distribution<float>::normal_distribution
            (in_stack_ffffffffffffffb0,
             (result_type_conflict2)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB84(in_stack_ffffffffffffffa8,0));
  if (*(int *)(*(long *)(in_RDI + 0x30) + 0xc) == 0) {
    __gen.distribution = *(normal_distribution<float> **)(in_RDI + 0x28);
    Dim::size((Dim *)__gen.distribution);
    std::generate<float*,dynet::TensorTools::randomize_normal(dynet::Tensor&,float,float)::__0>
              (in_stack_ffffffffffffffa8,(float *)0xda4641,__gen);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Bad device type");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TensorTools::randomize_normal(Tensor& val, real mean, real stddev) {
  normal_distribution<real> distribution(mean, stddev);
  auto b = [&] {return distribution(*rndeng);};
  if (val.device->type == DeviceType::CPU) {
    generate(val.v, val.v + val.d.size(), b);
#if HAVE_CUDA
  } else if (val.device->type == DeviceType::GPU) {
    float* t = new float[val.d.size()];
    generate(t, t + val.d.size(), b);
    CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
    delete[] t;
#endif
  } else { throw std::runtime_error("Bad device type"); }
}